

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int fits_hdecompress(uchar *input,int smooth,int *a,int *ny,int *nx,int *scale,int *status)

{
  int iVar1;
  int *in_RCX;
  int *in_RDX;
  undefined4 in_ESI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int stat;
  int in_stack_00000098;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  int *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (*in_stack_00000008 < 1) {
    iVar1 = decode((uchar *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,in_RCX,in_R8,in_R9);
    *in_stack_00000008 = iVar1;
    if (iVar1 == 0) {
      undigitize(in_RDX,*in_R8,*in_RCX,*in_R9);
      iVar1 = hinv(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009c,
                   in_stack_00000098);
      *in_stack_00000008 = iVar1;
      local_4 = *in_stack_00000008;
    }
    else {
      local_4 = *in_stack_00000008;
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int fits_hdecompress(unsigned char *input, int smooth, int *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
int stat;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv(a, *nx, *ny, smooth, *scale);
        *status = stat;
	
  return(*status);
}